

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall Timer::removeTimedEvent(Timer *this,Event *ev)

{
  bool bVar1;
  TimerNode *pTVar2;
  Event *pEVar3;
  iterator local_80;
  undefined1 local_78 [16];
  iterator node;
  undefined1 local_58 [8];
  AutoLock _auto_lock_;
  TimerNode timer;
  Event *ev_local;
  Timer *this_local;
  
  TimerNode::TimerNode((TimerNode *)&_auto_lock_.mLine);
  AutoLock::AutoLock((AutoLock *)local_58,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0x186);
  JetHead::list<Timer::TimerNode>::begin((list<Timer::TimerNode> *)(local_78 + 8));
  while( true ) {
    JetHead::list<Timer::TimerNode>::end((list<Timer::TimerNode> *)local_78);
    bVar1 = JetHead::list<Timer::TimerNode>::iterator::operator!=
                      ((iterator *)(local_78 + 8),(iterator *)local_78);
    JetHead::list<Timer::TimerNode>::iterator::~iterator((iterator *)local_78);
    if (!bVar1) break;
    pTVar2 = JetHead::list<Timer::TimerNode>::iterator::operator*((iterator *)(local_78 + 8));
    TimerNode::operator=((TimerNode *)&_auto_lock_.mLine,pTVar2);
    pEVar3 = SmartPtr::operator_cast_to_Event_((SmartPtr *)&_auto_lock_.mLine);
    if (pEVar3 == ev) {
      JetHead::list<Timer::TimerNode>::iterator::erase(&local_80);
      local_78._8_8_ = local_80.mNode;
      JetHead::list<Timer::TimerNode>::iterator::~iterator(&local_80);
    }
    else {
      JetHead::list<Timer::TimerNode>::iterator::operator++((iterator *)(local_78 + 8));
    }
  }
  JetHead::list<Timer::TimerNode>::iterator::~iterator((iterator *)(local_78 + 8));
  AutoLock::~AutoLock((AutoLock *)local_58);
  TimerNode::~TimerNode((TimerNode *)&_auto_lock_.mLine);
  return;
}

Assistant:

void Timer::removeTimedEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	TimerNode timer;
	
	DebugAutoLock( mMutex );

	JetHead::list<TimerNode>::iterator node = mList.begin();
	while (node != mList.end())
	{
		// Cast the node as a TimerNode
		timer = *node;
		
		// Check if the timer node has an event for the dispatcher
		// specified
		if ( (Event*)timer.mEvent == ev )
		{
			node = node.erase();
			continue;
		}
		++node;
	}	
}